

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::UniDirectionalLSTMLayerParams
          (UniDirectionalLSTMLayerParams *this,UniDirectionalLSTMLayerParams *from)

{
  void *pvVar1;
  LSTMParams *from_00;
  LSTMWeightParams *from_01;
  uint64 uVar2;
  LSTMParams *this_00;
  LSTMWeightParams *this_01;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__UniDirectionalLSTMLayerParams_00768e10;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::RepeatedPtrField
            (&this->activations_,&from->activations_);
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  from_00 = from->params_;
  if (from_00 == (LSTMParams *)0x0 ||
      from == (UniDirectionalLSTMLayerParams *)&_UniDirectionalLSTMLayerParams_default_instance_) {
    this_00 = (LSTMParams *)0x0;
  }
  else {
    this_00 = (LSTMParams *)operator_new(0x20);
    LSTMParams::LSTMParams(this_00,from_00);
  }
  this->params_ = this_00;
  from_01 = from->weightparams_;
  if (from_01 == (LSTMWeightParams *)0x0 ||
      from == (UniDirectionalLSTMLayerParams *)&_UniDirectionalLSTMLayerParams_default_instance_) {
    this_01 = (LSTMWeightParams *)0x0;
  }
  else {
    this_01 = (LSTMWeightParams *)operator_new(0x90);
    LSTMWeightParams::LSTMWeightParams(this_01,from_01);
  }
  this->weightparams_ = this_01;
  uVar2 = from->outputvectorsize_;
  this->inputvectorsize_ = from->inputvectorsize_;
  this->outputvectorsize_ = uVar2;
  this->reverseinput_ = from->reverseinput_;
  return;
}

Assistant:

UniDirectionalLSTMLayerParams::UniDirectionalLSTMLayerParams(const UniDirectionalLSTMLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      activations_(from.activations_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_params()) {
    params_ = new ::CoreML::Specification::LSTMParams(*from.params_);
  } else {
    params_ = NULL;
  }
  if (from.has_weightparams()) {
    weightparams_ = new ::CoreML::Specification::LSTMWeightParams(*from.weightparams_);
  } else {
    weightparams_ = NULL;
  }
  ::memcpy(&inputvectorsize_, &from.inputvectorsize_,
    reinterpret_cast<char*>(&reverseinput_) -
    reinterpret_cast<char*>(&inputvectorsize_) + sizeof(reverseinput_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.UniDirectionalLSTMLayerParams)
}